

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

int __thiscall duckdb_re2::RE2::ReverseProgramSize(RE2 *this)

{
  Prog *pPVar1;
  int iVar2;
  
  iVar2 = -1;
  if (this->prog_ != (Prog *)0x0) {
    pPVar1 = ReverseProg(this);
    if (pPVar1 != (Prog *)0x0) {
      iVar2 = pPVar1->size_;
    }
  }
  return iVar2;
}

Assistant:

int RE2::ReverseProgramSize() const {
  if (prog_ == NULL)
    return -1;
  Prog* prog = ReverseProg();
  if (prog == NULL)
    return -1;
  return prog->size();
}